

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Thing_Hate(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  TObjPtr<AActor> *pTVar1;
  uint uVar2;
  AActor *pAVar3;
  AActor *this;
  AActor *pAVar4;
  AActor *pAVar5;
  bool bVar6;
  FActorIterator hateeIt;
  FActorIterator haterIt;
  
  haterIt.base = (AActor *)0x0;
  hateeIt.base = (AActor *)0x0;
  hateeIt.id = arg1;
  haterIt.id = arg0;
  if (arg1 == 0) {
    pAVar3 = (AActor *)0x0;
    bVar6 = false;
  }
  else {
    do {
      pAVar3 = FActorIterator::Next(&hateeIt);
      bVar6 = pAVar3 == (AActor *)0x0;
      if (bVar6) {
        pAVar3 = (AActor *)0x0;
        break;
      }
    } while (((((pAVar3->flags).Value & 4) == 0) || (pAVar3->health < 1)) ||
            (((pAVar3->flags2).Value & 0x10000000) != 0));
  }
  if (arg0 == 0) {
    if (it == (AActor *)0x0) {
LAB_004a7221:
      this = (AActor *)0x0;
    }
    else {
      this = it;
      if (it->player != (player_t *)0x0) {
        return 0;
      }
    }
  }
  else {
    do {
      this = FActorIterator::Next(&haterIt);
      if (this == (AActor *)0x0) goto LAB_004a7221;
    } while ((this->health < 1) || (((this->flags).Value & 4) == 0));
  }
  do {
    if (this == (AActor *)0x0) {
      return 1;
    }
    pAVar4 = pAVar3;
    if (this->SeeState != (FState *)0x0) {
      if (arg2 == 0) {
LAB_004a7307:
        uVar2 = (this->flags3).Value & 0xffffff7f;
      }
      else {
        (this->LastLookActor).field_0.p = (AActor *)0x0;
        this->TIDtoHate = arg1;
        if (arg1 != 0) {
          pTVar1 = &this->target;
          pAVar4 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
          if ((pAVar4 != (AActor *)0x0) &&
             (pAVar4 = GC::ReadBarrier<AActor>((AActor **)pTVar1), pAVar4->tid != arg1)) {
            (pTVar1->field_0).p = (AActor *)0x0;
          }
          pTVar1 = &this->lastenemy;
          pAVar4 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
          if ((pAVar4 != (AActor *)0x0) &&
             (pAVar4 = GC::ReadBarrier<AActor>((AActor **)pTVar1), pAVar4->tid != arg1)) {
            (pTVar1->field_0).p = (AActor *)0x0;
          }
        }
        if ((6 < (uint)arg2) || ((0x54U >> (arg2 & 0x1fU) & 1) == 0)) goto LAB_004a7307;
        uVar2 = (this->flags3).Value | 0x80;
      }
      if (arg2 - 3U < 2) {
        (this->flags3).Value = uVar2 | 0x80000000;
LAB_004a7347:
        *(byte *)&(this->flags4).Value = (byte)(this->flags4).Value & 0xfe;
      }
      else {
        (this->flags3).Value = uVar2 & 0x7fffffff;
        if (1 < arg2 - 5U) goto LAB_004a7347;
        *(byte *)&(this->flags4).Value = (byte)(this->flags4).Value | 1;
      }
      pAVar4 = it;
      if (arg1 == 0) {
LAB_004a7371:
        if (pAVar4 == (AActor *)0x0) {
          pAVar4 = (AActor *)0x0;
          goto LAB_004a7459;
        }
      }
      else {
        pAVar4 = pAVar3;
        if (bVar6) {
          pAVar4 = (AActor *)0x0;
        }
        if (arg2 == 0 || bVar6) goto LAB_004a7371;
        do {
          do {
            pAVar4 = FActorIterator::Next(&hateeIt);
          } while (pAVar4 == this || pAVar4 == (AActor *)0x0);
        } while (((((pAVar4->flags).Value & 4) == 0) || (pAVar4->health < 1)) ||
                (((pAVar4->flags2).Value & 0x10000000) != 0));
      }
      if (pAVar4 != this) {
        if (arg2 == 0) {
LAB_004a7407:
          pAVar3 = GC::ReadBarrier<AActor>((AActor **)&this->target);
          if (pAVar3 != (AActor *)0x0) {
            (this->lastenemy).field_0 = (this->target).field_0;
          }
          (this->target).field_0.p = pAVar4;
          if ((((this->flags2).Value & 0x10000000) == 0) && (0 < this->health)) {
            AActor::SetState(this,this->SeeState,false);
          }
        }
        else {
          pAVar3 = GC::ReadBarrier<AActor>((AActor **)&this->goal);
          if (pAVar3 != (AActor *)0x0) {
            pAVar3 = GC::ReadBarrier<AActor>((AActor **)&this->goal);
            pAVar5 = GC::ReadBarrier<AActor>((AActor **)&this->target);
            if (pAVar5 != pAVar3) goto LAB_004a7407;
          }
        }
      }
    }
LAB_004a7459:
    this = (AActor *)0x0;
    pAVar3 = pAVar4;
    if (arg0 != 0) {
      do {
        this = FActorIterator::Next(&haterIt);
        if (this == (AActor *)0x0) {
          this = (AActor *)0x0;
          break;
        }
      } while ((this->health < 1) || (((this->flags).Value & 4) == 0));
    }
  } while( true );
}

Assistant:

FUNC(LS_Thing_Hate)
// Thing_Hate (hater, hatee, group/"xray"?)
{
	FActorIterator haterIt (arg0);
	AActor *hater, *hatee = NULL;
	FActorIterator hateeIt (arg1);
	bool nothingToHate = false;

	if (arg1 != 0)
	{
		while ((hatee = hateeIt.Next ()))
		{
			if (hatee->flags & MF_SHOOTABLE	&&	// can't hate nonshootable things
				hatee->health > 0 &&			// can't hate dead things
				!(hatee->flags2 & MF2_DORMANT))	// can't target dormant things
			{
				break;
			}
		}
		if (hatee == NULL)
		{ // Nothing to hate
			nothingToHate = true;
		}
	}

	if (arg0 == 0)
	{
		if (it != NULL && it->player != NULL)
		{
			// Players cannot have their attitudes set
			return false;
		}
		else
		{
			hater = it;
		}
	}
	else
	{
		while ((hater = haterIt.Next ()))
		{
			if (hater->health > 0 && hater->flags & MF_SHOOTABLE)
			{
				break;
			}
		}
	}
	while (hater != NULL)
	{
		// Can't hate if can't attack.
		if (hater->SeeState != NULL)
		{
			// If hating a group of things, record the TID and NULL
			// the target (if its TID doesn't match). A_Look will
			// find an appropriate thing to go chase after.
			if (arg2 != 0)
			{
				hater->TIDtoHate = arg1;
				hater->LastLookActor = NULL;

				// If the TID to hate is 0, then don't forget the target and
				// lastenemy fields.
				if (arg1 != 0)
				{
					if (hater->target != NULL && hater->target->tid != arg1)
					{
						hater->target = NULL;
					}
					if (hater->lastenemy != NULL && hater->lastenemy->tid != arg1)
					{
						hater->lastenemy = NULL;
					}
				}
			}
			// Hate types for arg2:
			//
			// 0 - Just hate one specific actor
			// 1 - Hate actors with given TID and attack players when shot
			// 2 - Same as 1, but will go after enemies without seeing them first
			// 3 - Hunt actors with given TID and also players
			// 4 - Same as 3, but will go after monsters without seeing them first
			// 5 - Hate actors with given TID and ignore player attacks
			// 6 - Same as 5, but will go after enemies without seeing them first

			// Note here: If you use Thing_Hate (tid, 0, 2), you can make
			// a monster go after a player without seeing him first.
			if (arg2 == 2 || arg2 == 4 || arg2 == 6)
			{
				hater->flags3 |= MF3_NOSIGHTCHECK;
			}
			else
			{
				hater->flags3 &= ~MF3_NOSIGHTCHECK;
			}
			if (arg2 == 3 || arg2 == 4)
			{
				hater->flags3 |= MF3_HUNTPLAYERS;
			}
			else
			{
				hater->flags3 &= ~MF3_HUNTPLAYERS;
			}
			if (arg2 == 5 || arg2 == 6)
			{
				hater->flags4 |= MF4_NOHATEPLAYERS;
			}
			else
			{
				hater->flags4 &= ~MF4_NOHATEPLAYERS;
			}

			if (arg1 == 0)
			{
				hatee = it;
			}
			else if (nothingToHate)
			{
				hatee = NULL;
			}
			else if (arg2 != 0)
			{
				do
				{
					hatee = hateeIt.Next ();
				}
				while ( hatee == NULL ||
						hatee == hater ||					// can't hate self
						!(hatee->flags & MF_SHOOTABLE) ||	// can't hate nonshootable things
						hatee->health <= 0 ||				// can't hate dead things
						(hatee->flags2 & MF2_DORMANT));	
			}

			if (hatee != NULL && hatee != hater && (arg2 == 0 || (hater->goal != NULL && hater->target != hater->goal)))
			{
				if (hater->target)
				{
					hater->lastenemy = hater->target;
				}
				hater->target = hatee;
				if (!(hater->flags2 & MF2_DORMANT))
				{
					if (hater->health > 0) hater->SetState (hater->SeeState);
				}
			}
		}
		if (arg0 != 0)
		{
			while ((hater = haterIt.Next ()))
			{
				if (hater->health > 0 && hater->flags & MF_SHOOTABLE)
				{
					break;
				}
			}
		}
		else
		{
			hater = NULL;
		}
	}
	return true;
}